

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O0

Node * __thiscall Node::add_child(Node *this,player_move *playerMove)

{
  Node *this_00;
  Node *local_20;
  Node *node;
  player_move *playerMove_local;
  Node *this_local;
  
  node = (Node *)playerMove;
  playerMove_local = (player_move *)this;
  this_00 = (Node *)operator_new(0x40);
  Node(this_00,playerMove,this);
  local_20 = this_00;
  std::vector<Node_*,_std::allocator<Node_*>_>::push_back(&this->m_children,&local_20);
  return local_20;
}

Assistant:

Node* Node::add_child(player_move playerMove)
{
    Node* node = new Node(&playerMove, this);
    this->m_children.push_back(node);
    return node;
}